

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O0

int __thiscall
webrtc::AudioProcessingImpl::StartDebugRecording
          (AudioProcessingImpl *this,FILE *handle,int64_t max_log_size_bytes)

{
  CritScope local_38;
  CritScope cs_capture;
  CritScope cs_render;
  int64_t max_log_size_bytes_local;
  FILE *handle_local;
  AudioProcessingImpl *this_local;
  
  rtc::CritScope::CritScope(&cs_capture,&this->crit_render_);
  rtc::CritScope::CritScope(&local_38,&this->crit_capture_);
  if (handle == (FILE *)0x0) {
    this_local._4_4_ = -5;
  }
  else {
    this_local._4_4_ = -4;
  }
  rtc::CritScope::~CritScope(&local_38);
  rtc::CritScope::~CritScope(&cs_capture);
  return this_local._4_4_;
}

Assistant:

int AudioProcessingImpl::StartDebugRecording(FILE* handle,
                                             int64_t max_log_size_bytes) {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

  if (handle == nullptr) {
    return kNullPointerError;
  }

#ifdef WEBRTC_AUDIOPROC_DEBUG_DUMP
  debug_dump_.num_bytes_left_for_log_ = max_log_size_bytes;

  // Stop any ongoing recording.
  if (debug_dump_.debug_file->Open()) {
    if (debug_dump_.debug_file->CloseFile() == -1) {
      return kFileError;
    }
  }

  if (debug_dump_.debug_file->OpenFromFileHandle(handle, true, false) == -1) {
    return kFileError;
  }

  RETURN_ON_ERR(WriteConfigMessage(true));
  RETURN_ON_ERR(WriteInitMessage());
  return kNoError;
#else
  return kUnsupportedFunctionError;
#endif  // WEBRTC_AUDIOPROC_DEBUG_DUMP
}